

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_system(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  void *val;
  TCGContext_conflict1 *s_00;
  TCGv_ptr pTVar2;
  _Bool _Var3;
  uint uVar4;
  uint val_00;
  uint reg;
  int iVar5;
  uintptr_t o;
  ARMCPRegInfo_conflict *pAVar6;
  TCGv_i64 pTVar7;
  TCGv_i32 pTVar8;
  TCGv_i32 pTVar9;
  TCGTemp *ts;
  TCGv_i64 pTVar10;
  TCGBar TVar11;
  uint64_t dest;
  byte bVar12;
  uint val_01;
  uintptr_t o_8;
  uint uVar13;
  TCGBar mb_type;
  uint32_t bits;
  TCGOpcode opc;
  code *pcVar14;
  byte bVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  TCGArg a3;
  uint uVar20;
  uint uVar21;
  uintptr_t o_7;
  list_item *plVar23;
  uintptr_t o_10;
  TCGTemp *pTVar24;
  bool bVar25;
  TCGLabel *local_b8;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  ulong local_60;
  ARMCPRegInfo_conflict *local_58;
  uint32_t local_4c;
  undefined4 local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  ulong uVar19;
  ulong uVar22;
  
  val_01 = insn >> 0x15 & 1;
  uVar16 = insn >> 0x13;
  uVar4 = insn >> 0x10 & 7;
  local_60 = (ulong)uVar4;
  uVar18 = insn >> 0xc & 0xf;
  uVar19 = (ulong)uVar18;
  uVar13 = insn >> 8;
  val_00 = uVar13 & 0xf;
  uVar21 = insn >> 5 & 7;
  uVar22 = (ulong)uVar21;
  reg = insn & 0x1f;
  uVar20 = uVar16 & 3;
  if (uVar20 != 0) {
    pTVar1 = s->uc->tcg_ctx;
    plVar23 = s->uc->hook[1].head;
    if (plVar23 == (list_item *)0x0) {
      local_b8 = (TCGLabel *)0x0;
    }
    else {
      bVar25 = uVar20 == 1;
      bVar12 = (byte)val_01;
      local_48 = CONCAT31((uint3)(insn >> 0x1b),(byte)uVar16 >> 1 & bVar12);
      local_4c = insn;
      local_44 = uVar20;
      local_40 = uVar19;
      local_38 = uVar22;
      uVar17 = local_48;
      do {
        uVar18 = (uint)uVar19;
        uVar21 = (uint)uVar22;
        val = plVar23->data;
        if (val == (void *)0x0) break;
        if ((*(char *)((long)val + 0x14) != '\0') ||
           (*(ulong *)((long)val + 0x18) <= *(ulong *)((long)val + 0x20) &&
            (*(ulong *)((long)val + 0x20) < s->pc_curr || s->pc_curr < *(ulong *)((long)val + 0x18))
           )) goto switchD_0069f48c_default;
        switch(*(undefined4 *)((long)val + 4)) {
        case 1:
          bVar15 = (byte)uVar17;
          goto joined_r0x0069f4a9;
        case 2:
          if ((uVar16 & 2) == 0 || bVar12 != 0) break;
          goto LAB_0069f4bb;
        case 3:
          if (bVar25 && bVar12 == 0) goto LAB_0069f4bb;
          break;
        case 4:
          bVar15 = bVar25 & bVar12;
joined_r0x0069f4a9:
          if (bVar15 != 0) {
LAB_0069f4bb:
            s_00 = s->uc->tcg_ctx;
            local_b8 = gen_new_label_aarch64(s_00);
            local_58 = (ARMCPRegInfo_conflict *)
                       tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
            pTVar9 = (TCGv_i32)((long)local_58 - (long)s_00);
            pTVar8 = tcg_const_i32_aarch64(s_00,insn);
            pTVar7 = tcg_const_i64_aarch64(s_00,(int64_t)val);
            tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)(s_00->cpu_pc_arm64 + (long)s_00),
                                s->pc_curr);
            pAVar6 = local_58;
            local_88 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
            local_80 = (TCGTemp *)(pTVar8 + (long)s_00);
            local_78 = (TCGTemp *)(pTVar7 + (long)s_00);
            tcg_gen_callN_aarch64(s_00,helper_uc_hooksys64_aarch64,(TCGTemp *)local_58,3,&local_88);
            tcg_gen_brcondi_i32_aarch64(s_00,TCG_COND_NE,pTVar9,0,local_b8);
            insn = local_4c;
            tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)pAVar6);
            uVar22 = local_38;
            uVar21 = (uint)local_38;
            tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar8 + (long)s_00));
            tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar7 + (long)s_00));
            uVar18 = (uint)local_40;
            uVar19 = local_40;
            uVar20 = local_44;
            uVar17 = local_48;
            if (local_b8 != (TCGLabel *)0x0) goto LAB_0069f626;
          }
        }
switchD_0069f48c_default:
        uVar18 = (uint)uVar19;
        uVar21 = (uint)uVar22;
        plVar23 = plVar23->next;
      } while (plVar23 != (list_item *)0x0);
      local_b8 = (TCGLabel *)0x0;
    }
LAB_0069f626:
    pAVar6 = get_arm_cp_reginfo_aarch64
                       (s->cp_regs,
                        uVar21 + (uVar18 << 7 | (int)local_60 << 0xb | uVar20 << 0xe) + val_00 * 8 +
                        0x10130000);
    if ((pAVar6 == (ARMCPRegInfo_conflict *)0x0) ||
       (((uint)pAVar6->access >> (val_01 + s->current_el * 2 & 0x1f) & 1) == 0)) {
      unallocated_encoding_aarch64(s);
      goto switchD_0069f8a5_caseD_0;
    }
    if (pAVar6->accessfn == (CPAccessFn_conflict *)0x0) {
      if ((pAVar6->type & 0x8000) != 0) {
        tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i64,(TCGArg)(pTVar1->cpu_pc_arm64 + (long)pTVar1),
                            s->pc_curr);
      }
    }
    else {
      local_58 = pAVar6;
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i64,(TCGArg)(pTVar1->cpu_pc_arm64 + (long)pTVar1),
                          s->pc_curr);
      pTVar7 = tcg_const_i64_aarch64(pTVar1,(int64_t)local_58);
      pTVar8 = tcg_const_i32_aarch64
                         (pTVar1,(uVar18 << 10 |
                                 (int)local_60 << 0xe | uVar20 << 0x14 | uVar21 << 0x11) +
                                 val_00 * 2 | reg << 5 | val_01 | 0x62000000);
      pTVar9 = tcg_const_i32_aarch64(pTVar1,val_01);
      local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      local_78 = (TCGTemp *)(pTVar8 + (long)pTVar1);
      local_70 = (TCGTemp *)(pTVar9 + (long)pTVar1);
      tcg_gen_callN_aarch64(pTVar1,helper_access_check_cp_reg_aarch64,(TCGTemp *)0x0,4,&local_88);
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar7 + (long)pTVar1));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar8 + (long)pTVar1));
      pAVar6 = local_58;
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar9 + (long)pTVar1));
    }
    uVar21 = pAVar6->type;
    uVar18 = (uVar21 & 0xfffe0f01) - 0x101;
    switch(uVar18 * 0x1000000 | uVar18 >> 8) {
    case 0:
      break;
    default:
      if ((uVar21 >> 0xc & 1) != 0) {
        if (s->fp_access_checked == true) {
          __assert_fail("!s->fp_access_checked",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x487,"_Bool fp_access_check(DisasContext *)");
        }
        s->fp_access_checked = true;
        if (s->fp_excp_el != 0) {
          gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
          break;
        }
      }
      if (((uVar21 >> 0xd & 1) != 0) && (_Var3 = sve_access_check_aarch64(s), !_Var3)) break;
      pTVar7 = cpu_reg_aarch64(s,reg);
      if (val_01 == 0) {
        if ((pAVar6->type & 2U) != 0) break;
        if (pAVar6->writefn != (CPWriteFn_conflict *)0x0) {
          pTVar10 = tcg_const_i64_aarch64(pTVar1,(int64_t)pAVar6);
          pTVar2 = pTVar1->cpu_env;
          local_78 = (TCGTemp *)(pTVar7 + (long)pTVar1);
          pcVar14 = helper_set_cp_reg64_aarch64;
          pTVar24 = (TCGTemp *)0x0;
          iVar5 = 3;
          goto LAB_0069fceb;
        }
        a3 = pAVar6->fieldoffset;
        pTVar2 = pTVar1->cpu_env;
        opc = INDEX_op_st_i64;
LAB_006a009c:
        tcg_gen_op3_aarch64(pTVar1,opc,(TCGArg)(pTVar7 + (long)pTVar1),
                            (TCGArg)(pTVar2 + (long)pTVar1),a3);
      }
      else if ((pAVar6->type & 2U) == 0) {
        if (pAVar6->readfn == (CPReadFn_conflict *)0x0) {
          a3 = pAVar6->fieldoffset;
          pTVar2 = pTVar1->cpu_env;
          opc = INDEX_op_ld_i64;
          goto LAB_006a009c;
        }
        pTVar10 = tcg_const_i64_aarch64(pTVar1,(int64_t)pAVar6);
        pTVar2 = pTVar1->cpu_env;
        pTVar24 = (TCGTemp *)(pTVar7 + (long)pTVar1);
        pcVar14 = helper_get_cp_reg64_aarch64;
        iVar5 = 2;
LAB_0069fceb:
        local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
        local_80 = (TCGTemp *)(pTVar10 + (long)pTVar1);
        tcg_gen_callN_aarch64(pTVar1,pcVar14,pTVar24,iVar5,&local_88);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar10 + (long)pTVar1));
      }
      else {
        tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i64,(TCGArg)(pTVar7 + (long)pTVar1),
                            pAVar6->resetvalue);
      }
      if (((((s->base).tb)->cflags & 0x20000) != 0) && ((pAVar6->type & 0x40) != 0)) {
        (s->base).is_jmp = DISAS_TARGET_1;
      }
      if ((val_01 == 0) && ((pAVar6->type & 8) == 0)) {
        pTVar8 = tcg_const_i32_aarch64(pTVar1,s->current_el);
        local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
        local_80 = (TCGTemp *)(pTVar8 + (long)pTVar1);
        tcg_gen_callN_aarch64(pTVar1,helper_rebuild_hflags_a64_aarch64,(TCGTemp *)0x0,2,&local_88);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar8 + (long)pTVar1));
        (s->base).is_jmp = DISAS_TARGET_1;
      }
      break;
    case 2:
      pTVar7 = cpu_reg_aarch64(s,reg);
      if (val_01 == 0) {
        gen_set_nzcv(pTVar1,pTVar7);
      }
      else {
        pTVar24 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        pTVar8 = (TCGv_i32)((long)pTVar24 - (long)pTVar1);
        ts = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        pTVar9 = (TCGv_i32)((long)ts - (long)pTVar1);
        tcg_gen_andi_i32_aarch64(pTVar1,pTVar9,pTVar1->cpu_NF,-0x80000000);
        tcg_gen_setcondi_i32_aarch64(pTVar1,TCG_COND_EQ,pTVar8,pTVar1->cpu_ZF,0);
        tcg_gen_deposit_i32_aarch64(pTVar1,pTVar9,pTVar9,pTVar8,0x1e,1);
        tcg_gen_deposit_i32_aarch64(pTVar1,pTVar9,pTVar9,pTVar1->cpu_CF,0x1d,1);
        tcg_gen_shri_i32_aarch64(pTVar1,pTVar8,pTVar1->cpu_VF,0x1f);
        tcg_gen_deposit_i32_aarch64(pTVar1,pTVar9,pTVar9,pTVar8,0x1c,1);
        tcg_gen_extu_i32_i64_aarch64(pTVar1,pTVar7,pTVar9);
        tcg_temp_free_internal_aarch64(pTVar1,ts);
        tcg_temp_free_internal_aarch64(pTVar1,pTVar24);
      }
      break;
    case 3:
      pTVar7 = cpu_reg_aarch64(s,reg);
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i64,(TCGArg)(pTVar7 + (long)pTVar1),
                          (long)(s->current_el << 2));
      break;
    case 4:
      pTVar7 = cpu_reg_aarch64(s,reg);
      pTVar7 = clean_data_tbi(s,pTVar7);
      local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      tcg_gen_callN_aarch64(pTVar1,helper_dc_zva_aarch64,(TCGTemp *)0x0,2,&local_88);
    }
switchD_0069f8a5_caseD_0:
    if (local_b8 == (TCGLabel *)0x0) {
      return;
    }
    pTVar1 = s->uc->tcg_ctx;
    *(uint *)local_b8 = *(uint *)local_b8 | 1;
    tcg_gen_op1_aarch64(pTVar1,INDEX_op_set_label,(TCGArg)local_b8);
    return;
  }
  if (reg != 0x1f || val_01 != 0) goto switchD_0069fad1_caseD_3;
  if (uVar18 != 4) {
    if (uVar18 == 3) {
      if ((uVar4 == 3) && (uVar21 - 2 < 6)) {
        pTVar1 = s->uc->tcg_ctx;
        switch(uVar21) {
        case 2:
          tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i64,
                              (TCGArg)(pTVar1->cpu_exclusive_addr + (long)pTVar1),0xffffffffffffffff
                             );
          return;
        case 3:
          break;
        default:
          TVar11 = TCG_BAR_SC|TCG_MO_ALL;
          if ((uVar13 & 3) == 2) {
            TVar11 = TCG_BAR_SC|TCG_MO_ST_ST;
          }
          mb_type = TCG_BAR_SC|TCG_MO_LD_ST|TCG_MO_LD_LD;
          if ((uVar13 & 3) != 1) {
            mb_type = TVar11;
          }
          tcg_gen_mb_aarch64(pTVar1,mb_type);
          return;
        case 6:
          reset_btype(s);
          dest = (s->base).pc_next;
LAB_006a0019:
          gen_goto_tb(s,0,dest);
          return;
        case 7:
          if ((val_00 == 0) && ((s->isar->id_aa64isar1 & 0xf000000000) != 0)) {
            tcg_gen_mb_aarch64(pTVar1,TCG_BAR_SC|TCG_MO_ALL);
            dest = (s->base).pc_next;
            goto LAB_006a0019;
          }
        }
      }
      goto switchD_0069fad1_caseD_3;
    }
    if ((uVar18 != 2) || (uVar4 != 3)) goto switchD_0069fad1_caseD_3;
    iVar5 = uVar21 + val_00 * 8;
    if (0x1e < iVar5 - 1U) {
      return;
    }
    pTVar1 = s->uc->tcg_ctx;
    switch(iVar5) {
    case 1:
      if ((((s->base).tb)->cflags & 0x80000) != 0) {
        return;
      }
      (s->base).is_jmp = DISAS_TARGET_7;
      return;
    case 2:
      if ((((s->base).tb)->cflags & 0x80000) != 0) {
        return;
      }
      (s->base).is_jmp = DISAS_TARGET_4;
      return;
    case 3:
      (s->base).is_jmp = DISAS_TARGET_2;
      return;
    default:
      goto switchD_0069f831_caseD_4;
    case 7:
      if (s->pauth_active != true) {
        return;
      }
      local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar1->cpu_X[0x1e] + (long)pTVar1);
      pcVar14 = helper_xpaci_aarch64;
      iVar5 = 2;
      goto LAB_006a053a;
    case 8:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x11];
      pTVar7 = pTVar1->cpu_X[0x10];
      goto LAB_006a04c6;
    case 10:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x11];
      pTVar7 = pTVar1->cpu_X[0x10];
      goto LAB_006a02cc;
    case 0xc:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x11];
      pTVar7 = pTVar1->cpu_X[0x10];
      goto LAB_006a033b;
    case 0xe:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x11];
      pTVar7 = pTVar1->cpu_X[0x10];
      goto LAB_006a0405;
    case 0x18:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar7 = pTVar1->cpu_X[0x1e];
      pTVar10 = new_tmp_a64_zero_aarch64(s);
      local_78 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      pcVar14 = helper_pacia_aarch64;
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      break;
    case 0x19:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x1e];
      pTVar7 = pTVar1->cpu_X[0x1f];
LAB_006a04c6:
      local_80 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_78 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      pcVar14 = helper_pacia_aarch64;
      break;
    case 0x1a:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar7 = pTVar1->cpu_X[0x1e];
      pTVar10 = new_tmp_a64_zero_aarch64(s);
      local_78 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      pcVar14 = helper_pacib_aarch64;
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      break;
    case 0x1b:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x1e];
      pTVar7 = pTVar1->cpu_X[0x1f];
LAB_006a02cc:
      local_80 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_78 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      pcVar14 = helper_pacib_aarch64;
      break;
    case 0x1c:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar7 = pTVar1->cpu_X[0x1e];
      pTVar10 = new_tmp_a64_zero_aarch64(s);
      local_78 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      pcVar14 = helper_autia_aarch64;
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      break;
    case 0x1d:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x1e];
      pTVar7 = pTVar1->cpu_X[0x1f];
LAB_006a033b:
      local_80 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_78 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      pcVar14 = helper_autia_aarch64;
      break;
    case 0x1e:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar7 = pTVar1->cpu_X[0x1e];
      pTVar10 = new_tmp_a64_zero_aarch64(s);
      local_78 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      pcVar14 = helper_autib_aarch64;
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      break;
    case 0x1f:
      if (s->pauth_active != true) {
        return;
      }
      pTVar2 = pTVar1->cpu_env;
      pTVar10 = pTVar1->cpu_X[0x1e];
      pTVar7 = pTVar1->cpu_X[0x1f];
LAB_006a0405:
      local_80 = (TCGTemp *)(pTVar10 + (long)pTVar1);
      local_88 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      local_78 = (TCGTemp *)(pTVar7 + (long)pTVar1);
      pcVar14 = helper_autib_aarch64;
    }
    iVar5 = 3;
LAB_006a053a:
    tcg_gen_callN_aarch64(pTVar1,pcVar14,local_80,iVar5,&local_88);
switchD_0069f831_caseD_4:
    return;
  }
  pTVar1 = s->uc->tcg_ctx;
  iVar5 = uVar21 + uVar4 * 8;
  (s->base).is_jmp = DISAS_TOO_MANY;
  switch(iVar5) {
  case 0:
    if ((val_00 == 0) && ((s->isar->id_aa64isar0 & 0xf0000000000000) != 0)) {
      tcg_gen_xori_i32_aarch64(pTVar1,pTVar1->cpu_CF,pTVar1->cpu_CF,1);
LAB_0069ff85:
      (s->base).is_jmp = DISAS_NEXT;
      return;
    }
    break;
  case 1:
    if ((val_00 == 0) && ((s->isar->id_aa64isar0 & 0xe0000000000000) != 0)) {
      pTVar24 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      tcg_gen_setcondi_i32_aarch64
                (pTVar1,TCG_COND_EQ,(TCGv_i32)((long)pTVar24 - (long)pTVar1),pTVar1->cpu_ZF,0);
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_or_i32,(TCGArg)(pTVar1->cpu_NF + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_CF + (long)pTVar1),(TCGArg)pTVar24);
      tcg_gen_subi_i32_aarch64(pTVar1,pTVar1->cpu_NF,pTVar1->cpu_NF,1);
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_and_i32,(TCGArg)(pTVar1->cpu_ZF + (long)pTVar1),
                          (TCGArg)pTVar24,(TCGArg)(pTVar1->cpu_CF + (long)pTVar1));
      tcg_gen_xori_i32_aarch64(pTVar1,pTVar1->cpu_ZF,pTVar1->cpu_ZF,1);
      tcg_gen_andc_i32_aarch64
                (pTVar1,pTVar1->cpu_VF,(TCGv_i32)((long)pTVar24 - (long)pTVar1),pTVar1->cpu_CF);
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_neg_i32,(TCGArg)(pTVar1->cpu_VF + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_VF + (long)pTVar1));
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_or_i32,(TCGArg)(pTVar1->cpu_CF + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_CF + (long)pTVar1),(TCGArg)pTVar24);
      tcg_temp_free_internal_aarch64(pTVar1,pTVar24);
      goto LAB_0069ff85;
    }
    break;
  case 2:
    if ((val_00 == 0) && ((s->isar->id_aa64isar0 & 0xe0000000000000) != 0)) {
      tcg_gen_sari_i32_aarch64(pTVar1,pTVar1->cpu_VF,pTVar1->cpu_VF,0x1f);
      tcg_gen_andc_i32_aarch64(pTVar1,pTVar1->cpu_CF,pTVar1->cpu_CF,pTVar1->cpu_VF);
      tcg_gen_andc_i32_aarch64(pTVar1,pTVar1->cpu_ZF,pTVar1->cpu_ZF,pTVar1->cpu_VF);
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_NF + (long)pTVar1),0);
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_VF + (long)pTVar1),0);
      goto LAB_0069ff85;
    }
    break;
  case 3:
    if (((s->isar->id_aa64mmfr2 & 0xf0) == 0) || (s->current_el == 0)) break;
    bits = 0x800000;
    goto LAB_0069fe53;
  case 4:
    if (((s->isar->id_aa64mmfr1 & 0xf00000) == 0) || (s->current_el == 0)) break;
    bits = 0x400000;
LAB_0069fe53:
    if ((insn >> 8 & 1) == 0) {
      clear_pstate_bits(pTVar1,bits);
    }
    else {
      set_pstate_bits(pTVar1,bits);
    }
    pTVar8 = tcg_const_i32_aarch64(pTVar1,s->current_el);
    local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
    local_80 = (TCGTemp *)(pTVar8 + (long)pTVar1);
    pcVar14 = helper_rebuild_hflags_a64_aarch64;
LAB_006a0170:
    pTVar24 = local_80;
    tcg_gen_callN_aarch64(pTVar1,pcVar14,(TCGTemp *)0x0,2,&local_88);
    tcg_temp_free_internal_aarch64(pTVar1,pTVar24);
    return;
  case 5:
    if (s->current_el == 0) break;
    pTVar8 = tcg_const_i32_aarch64(pTVar1,uVar13 & 1);
    local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
    local_80 = (TCGTemp *)(pTVar8 + (long)pTVar1);
    pcVar14 = helper_msr_i_spsel_aarch64;
    goto LAB_006a0170;
  default:
    if (iVar5 == 0x1e) {
      pTVar8 = tcg_const_i32_aarch64(pTVar1,val_00);
      local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar8 + (long)pTVar1);
      pcVar14 = helper_msr_i_daifset_aarch64;
      goto LAB_006a0170;
    }
    if (iVar5 == 0x1f) {
      pTVar8 = tcg_const_i32_aarch64(pTVar1,val_00);
      local_88 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_80 = (TCGTemp *)(pTVar8 + (long)pTVar1);
      tcg_gen_callN_aarch64(pTVar1,helper_msr_i_daifclear_aarch64,(TCGTemp *)0x0,2,&local_88);
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar8 + (long)pTVar1));
      (s->base).is_jmp = DISAS_TARGET_1;
      return;
    }
  }
switchD_0069fad1_caseD_3:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_system(DisasContext *s, uint32_t insn)
{
    unsigned int l, op0, op1, crn, crm, op2, rt;
    l = extract32(insn, 21, 1);
    op0 = extract32(insn, 19, 2);
    op1 = extract32(insn, 16, 3);
    crn = extract32(insn, 12, 4);
    crm = extract32(insn, 8, 4);
    op2 = extract32(insn, 5, 3);
    rt = extract32(insn, 0, 5);

    if (op0 == 0) {
        if (l || rt != 31) {
            unallocated_encoding(s);
            return;
        }
        switch (crn) {
        case 2: /* HINT (including allocated hints like NOP, YIELD, etc) */
            handle_hint(s, insn, op1, op2, crm);
            break;
        case 3: /* CLREX, DSB, DMB, ISB */
            handle_sync(s, insn, op1, op2, crm);
            break;
        case 4: /* MSR (immediate) */
            handle_msr_i(s, insn, op1, op2, crm);
            break;
        default:
            unallocated_encoding(s);
            break;
        }
        return;
    }
    handle_sys(s, insn, l, op0, op1, op2, crn, crm, rt);
}